

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

Quaternion ConvexDecomposition::operator*(Quaternion *a,Quaternion *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Quaternion QVar13;
  
  fVar1 = (a->super_float4).w;
  fVar2 = (b->super_float4).w;
  fVar3 = (a->super_float4).x;
  fVar4 = (a->super_float4).y;
  fVar5 = (b->super_float4).x;
  fVar6 = (b->super_float4).y;
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar3)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar2))
  ;
  auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)fVar6));
  fVar7 = (a->super_float4).z;
  fVar8 = (b->super_float4).z;
  auVar10 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar12 = ZEXT416((uint)fVar5);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar3)),ZEXT416((uint)fVar1),auVar12);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)fVar8));
  auVar11 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar7),ZEXT416((uint)fVar6));
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar3)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar6))
  ;
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)fVar2));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar7),auVar12);
  auVar9 = vinsertps_avx(auVar11,auVar9,0x10);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar6)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar8)
                           );
  auVar11 = vfnmadd231ss_fma(auVar11,ZEXT416((uint)fVar4),auVar12);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar7),ZEXT416((uint)fVar2));
  auVar11 = vinsertps_avx(auVar11,auVar10,0x10);
  QVar13.super_float4._0_8_ = auVar9._0_8_;
  QVar13.super_float4._8_8_ = auVar11._0_8_;
  return (Quaternion)QVar13.super_float4;
}

Assistant:

Quaternion operator*( const Quaternion& a, const Quaternion& b )
{
	Quaternion c;
	c.w = a.w*b.w - a.x*b.x - a.y*b.y - a.z*b.z;
	c.x = a.w*b.x + a.x*b.w + a.y*b.z - a.z*b.y; 
	c.y = a.w*b.y - a.x*b.z + a.y*b.w + a.z*b.x; 
	c.z = a.w*b.z + a.x*b.y - a.y*b.x + a.z*b.w; 
	return c;
}